

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

Inversion * __thiscall
OpenMD::SelectionManager::beginUnselectedInversion(SelectionManager *this,int *i)

{
  int iVar1;
  Inversion *pIVar2;
  
  iVar1 = OpenMDBitSet::firstOffBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
  *i = iVar1;
  if (iVar1 == -1) {
    pIVar2 = (Inversion *)0x0;
  }
  else {
    pIVar2 = (this->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1];
  }
  return pIVar2;
}

Assistant:

Inversion* SelectionManager::beginUnselectedInversion(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[INVERSION].size())) {
      if (!ss_.bitsets_[INVERSION][i]) {
        // check that this processor owns this inversion
        if (inversions_[i] != NULL) return inversions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[INVERSION].firstOffBit();
    return i == -1 ? NULL : inversions_[i];
#endif
  }